

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O1

aom_codec_err_t ctrl_use_reference(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  int *piVar2;
  
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    piVar2 = (int *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    piVar2 = (int *)args->overflow_arg_area;
    args->overflow_arg_area = piVar2 + 2;
  }
  av1_use_as_reference(&(ctx->ppi->cpi->ext_flags).ref_frame_flags,*piVar2);
  return AOM_CODEC_OK;
}

Assistant:

static aom_codec_err_t ctrl_use_reference(aom_codec_alg_priv_t *ctx,
                                          va_list args) {
  const int reference_flag = va_arg(args, int);

  av1_use_as_reference(&ctx->ppi->cpi->ext_flags.ref_frame_flags,
                       reference_flag);
  return AOM_CODEC_OK;
}